

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_tvp.c
# Opt level: O2

jas_tvparser_t * jas_tvparser_create(char *s)

{
  jas_tvparser_t *tvp;
  char *pcVar1;
  
  tvp = (jas_tvparser_t *)jas_malloc(0x20);
  if (tvp != (jas_tvparser_t *)0x0) {
    pcVar1 = jas_strdup(s);
    tvp->buf = pcVar1;
    if (pcVar1 != (char *)0x0) {
      tvp->pos = pcVar1;
      tvp->tag = (char *)0x0;
      tvp->val = (char *)0x0;
      return tvp;
    }
    jas_tvparser_destroy(tvp);
  }
  return (jas_tvparser_t *)0x0;
}

Assistant:

jas_tvparser_t *jas_tvparser_create(const char *s)
{
	jas_tvparser_t *tvp;
	if (!(tvp = jas_malloc(sizeof(jas_tvparser_t)))) {
		return 0;
	}
	if (!(tvp->buf = jas_strdup(s))) {
		jas_tvparser_destroy(tvp);
		return 0;
	}
	tvp->pos = tvp->buf;
	tvp->tag = 0;
	tvp->val = 0;
	return tvp;
}